

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O1

png_uint_32
png_get_sCAL_s(png_const_structrp png_ptr,png_const_inforp info_ptr,int *unit,png_charpp width,
              png_charpp height)

{
  png_uint_32 pVar1;
  
  pVar1 = 0;
  if ((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
     ((info_ptr->valid & 0x4000) != 0)) {
    *unit = (uint)info_ptr->scal_unit;
    *width = info_ptr->scal_s_width;
    *height = info_ptr->scal_s_height;
    pVar1 = 0x4000;
  }
  return pVar1;
}

Assistant:

png_uint_32 PNGAPI
png_get_sCAL_s(png_const_structrp png_ptr, png_const_inforp info_ptr,
    int *unit, png_charpp width, png_charpp height)
{
   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_sCAL) != 0)
   {
      *unit = info_ptr->scal_unit;
      *width = info_ptr->scal_s_width;
      *height = info_ptr->scal_s_height;
      return (PNG_INFO_sCAL);
   }

   return(0);
}